

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase241::~TestCase241(TestCase241 *this)

{
  TestCase241 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Schema, UnnamedUnion) {
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();

  EXPECT_TRUE(schema.findFieldByName("") == kj::none);

  EXPECT_TRUE(schema.findFieldByName("foo") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("bar") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("before") != kj::none);
  EXPECT_TRUE(schema.findFieldByName("after") != kj::none);
}